

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void approx(double *x,double *y,int N,double *xout,double *yout,int Nout)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  if (0 < Nout) {
    lVar5 = (long)(N + -1);
    uVar6 = 0;
    do {
      dVar1 = xout[uVar6];
      dVar10 = dVar1;
      if (!NAN(dVar1)) {
        if (*x <= dVar1) {
          dVar11 = x[lVar5];
          if (dVar1 <= dVar11) {
            if (N < 3) {
              lVar4 = 0;
              lVar8 = lVar5;
            }
            else {
              iVar3 = 0;
              iVar7 = N + -1;
              do {
                iVar9 = (iVar7 + iVar3) / 2;
                if (x[iVar9] <= dVar1) {
                  iVar3 = iVar9;
                  iVar9 = iVar7;
                }
                iVar7 = iVar9;
              } while (iVar3 < iVar7 + -1);
              dVar11 = x[iVar7];
              lVar4 = (long)iVar3;
              lVar8 = (long)iVar7;
            }
            if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) {
              dVar2 = x[lVar4];
              dVar10 = y[lVar4];
              if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
                dVar10 = ((dVar1 - dVar2) / (dVar11 - dVar2)) * (y[lVar8] - dVar10) + dVar10;
              }
            }
            else {
              dVar10 = y[lVar8];
            }
          }
          else {
            dVar10 = y[lVar5];
          }
        }
        else {
          dVar10 = *y;
        }
      }
      yout[uVar6] = dVar10;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)Nout);
  }
  return;
}

Assistant:

void approx(double *x,double *y, int N,double *xout, double *yout,int Nout) {
    int i;
	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

    for(i = 0; i < Nout;++i) {
        if (xout[i] == xout[i]) {
            yout[i] = interpolate_linear_sorted_ascending(x,y,N,xout[i]);
        } else {
            yout[i] = xout[i];
        }
    }

}